

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Message *descriptor;
  long lVar4;
  MessageOptions *pMVar5;
  ExtensionRangeOptions *pEVar6;
  long *plVar7;
  long *plVar8;
  void *pvVar9;
  OneofOptions *pOVar10;
  size_type *psVar11;
  DescriptorProto *extraout_RDX;
  DescriptorProto *extraout_RDX_00;
  DescriptorProto *proto_00;
  DescriptorProto *extraout_RDX_01;
  long lVar12;
  DescriptorBuilder *this_00;
  long lVar13;
  long lVar14;
  SubstituteArg *in_stack_fffffffffffffd78;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  string local_250;
  string local_230;
  SubstituteArg local_200;
  string local_1d0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  proto_00 = proto;
  this_00 = this;
  if (*(long *)(message + 0x20) == 0) {
    pMVar5 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar5;
    proto_00 = extraout_RDX;
  }
  if (0 < *(int *)(message + 0x70)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      this_00 = this;
      CrossLinkMessage(this,(Descriptor *)(*(long *)(message + 0x38) + lVar14),
                       (DescriptorProto *)
                       ((proto->nested_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar13]);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x90;
      proto_00 = extraout_RDX_00;
    } while (lVar13 < *(int *)(message + 0x70));
  }
  if (0 < *(int *)(message + 0x74)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      CrossLinkEnum(this_00,(EnumDescriptor *)(*(long *)(message + 0x40) + lVar14),
                    (EnumDescriptorProto *)proto_00);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x50;
      proto_00 = extraout_RDX_01;
    } while (lVar13 < *(int *)(message + 0x74));
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      CrossLinkField(this,(FieldDescriptor *)(*(long *)(message + 0x28) + lVar14),
                     (FieldDescriptorProto *)
                     ((proto->field_).super_RepeatedPtrFieldBase.rep_)->elements[lVar13]);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar13 < *(int *)(message + 0x68));
  }
  if (0 < *(int *)(message + 0x7c)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      CrossLinkField(this,(FieldDescriptor *)(*(long *)(message + 0x50) + lVar14),
                     (FieldDescriptorProto *)
                     ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar13]);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar13 < *(int *)(message + 0x7c));
  }
  if (0 < *(int *)(message + 0x78)) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      lVar12 = *(long *)(message + 0x48);
      if (*(long *)(lVar12 + lVar14) == 0) {
        pEVar6 = ExtensionRangeOptions::default_instance();
        *(ExtensionRangeOptions **)(lVar12 + lVar14) = pEVar6;
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < *(int *)(message + 0x78));
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar14 = -0x98;
    lVar13 = 0;
    do {
      plVar8 = *(long **)(*(long *)(message + 0x28) + 0xf0 + lVar14);
      if (plVar8 != (long *)0x0) {
        if ((0 < (int)plVar8[3]) &&
           (*(long **)(*(long *)(message + 0x28) + 0x58 + lVar14) != plVar8)) {
          local_270[0] = local_260;
          lVar12 = **(long **)(message + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_270,lVar12,(*(long **)(message + 8))[1] + lVar12);
          std::__cxx11::string::append((char *)local_270);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_270,
                                      **(ulong **)(*(long *)(message + 0x28) + lVar14));
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_250.field_2._M_allocated_capacity = *psVar11;
            local_250.field_2._8_8_ = plVar7[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar11;
            local_250._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_250._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          descriptor = (Message *)
                       ((proto->field_).super_RepeatedPtrFieldBase.rep_)->elements[lVar13 + -1];
          local_230._M_dataplus._M_p =
               (pointer)**(undefined8 **)(*(long *)(message + 0x28) + lVar14);
          local_230._M_string_length =
               CONCAT44(local_230._M_string_length._4_4_,
                        *(undefined4 *)(*(undefined8 **)(*(long *)(message + 0x28) + lVar14) + 1));
          local_200.text_ = *(char **)*plVar8;
          local_200.size_ = *(int *)((undefined8 *)*plVar8 + 1);
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          local_f0.text_ = (char *)0x0;
          local_f0.size_ = -1;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          strings::Substitute_abi_cxx11_
                    (&local_1d0,
                     (strings *)
                     "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                     ,(char *)&local_230,&local_200,&local_60,&local_90,&local_c0,&local_f0,
                     &local_120,&local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
          AddError(this,&local_250,descriptor,TYPE,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          if (local_270[0] != local_260) {
            operator_delete(local_270[0]);
          }
        }
        piVar1 = (int *)(*(long *)(message + 0x30) + 0x18 +
                        (long)((int)((ulong)((long)plVar8 - *(long *)(plVar8[2] + 0x30)) >> 4) *
                              -0x55555555) * 0x30);
        *piVar1 = *piVar1 + 1;
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar13 < *(int *)(message + 0x68));
  }
  if (0 < *(int *)(message + 0x6c)) {
    lVar13 = 5;
    lVar14 = 0;
    do {
      lVar12 = *(long *)(message + 0x30);
      if (*(int *)(lVar12 + -0x10 + lVar13 * 8) == 0) {
        local_200.text_ = local_200.scratch_ + 4;
        lVar4 = **(long **)(message + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,lVar4,(*(long **)(message + 8))[1] + lVar4);
        std::__cxx11::string::append((char *)&local_200);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_200,**(ulong **)(lVar12 + -0x28 + lVar13 * 8));
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_230.field_2._M_allocated_capacity = *psVar11;
          local_230.field_2._8_8_ = plVar8[3];
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar11;
          local_230._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_230._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        AddError(this,&local_230,
                 (Message *)((proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_)->elements[lVar14]
                 ,NAME,"Oneof must have at least one field.");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if (local_200.text_ != local_200.scratch_ + 4) {
          operator_delete(local_200.text_);
        }
      }
      pvVar9 = DescriptorPool::Tables::AllocateBytes
                         (this->tables_,*(int *)(lVar12 + -0x10 + lVar13 * 8) << 3);
      *(void **)(lVar12 + -8 + lVar13 * 8) = pvVar9;
      *(undefined4 *)(lVar12 + -0x10 + lVar13 * 8) = 0;
      if (*(long *)(lVar12 + lVar13 * 8) == 0) {
        pOVar10 = OneofOptions::default_instance();
        *(OneofOptions **)(lVar12 + lVar13 * 8) = pOVar10;
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 6;
    } while (lVar14 < *(int *)(message + 0x6c));
  }
  iVar2 = *(int *)(message + 0x68);
  if (0 < (long)iVar2) {
    lVar13 = 0;
    do {
      lVar14 = *(long *)(message + 0x28);
      lVar12 = *(long *)(lVar14 + 0x58 + lVar13);
      if (lVar12 != 0) {
        lVar4 = *(long *)(message + 0x30);
        lVar12 = (long)((int)((ulong)(lVar12 - *(long *)(*(long *)(lVar12 + 0x10) + 0x30)) >> 4) *
                       -0x55555555) * 0x30;
        iVar3 = *(int *)(lVar4 + 0x18 + lVar12);
        *(int *)(lVar14 + 0x48 + lVar13) = iVar3;
        *(int *)(lVar4 + 0x18 + lVar12) = iVar3 + 1;
        *(long *)(*(long *)(lVar4 + 0x20 + lVar12) + (long)iVar3 * 8) = lVar14 + lVar13;
      }
      lVar13 = lVar13 + 0x98;
    } while ((long)iVar2 * 0x98 - lVar13 != 0);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  if (message->options_ == nullptr) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < message->extension_range_count(); i++) {
    CrossLinkExtensionRange(&message->extension_ranges_[i],
                            proto.extension_range(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(message->full_name() + "." + message->field(i - 1)->name(),
                 proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute(
                     "Fields in the same oneof must be defined consecutively. "
                     "\"$0\" cannot be defined before the completion of the "
                     "\"$1\" oneof definition.",
                     message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ = tables_->AllocateArray<const FieldDescriptor*>(
        oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == nullptr) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }
}